

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 simd_test_avx2::c_imm_v64_shr_n_s8<4>(c_v64 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2[8] = 0xf;
  auVar2._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar2[9] = 0xf;
  auVar2[10] = 0xf;
  auVar2[0xb] = 0xf;
  auVar2[0xc] = 0xf;
  auVar2[0xd] = 0xf;
  auVar2[0xe] = 0xf;
  auVar2[0xf] = 0xf;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64;
  auVar1 = vpsrlw_avx(auVar1,4);
  auVar1 = vpand_avx(auVar1,auVar2);
  auVar3[8] = 8;
  auVar3._0_8_ = 0x808080808080808;
  auVar3[9] = 8;
  auVar3[10] = 8;
  auVar3[0xb] = 8;
  auVar3[0xc] = 8;
  auVar3[0xd] = 8;
  auVar3[0xe] = 8;
  auVar3[0xf] = 8;
  auVar1 = vpsubb_avx(auVar1 ^ auVar3,auVar3);
  return (c_v64)auVar1._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}